

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

path * __thiscall ghc::filesystem::path::extension(path *this)

{
  bool bVar1;
  iterator *this_00;
  string_type *in_RDI;
  size_type pos;
  path *fn;
  iterator iter;
  iterator *in_stack_ffffffffffffff30;
  path *in_stack_ffffffffffffff40;
  format fmt;
  string_type *this_01;
  string local_98 [32];
  long local_78;
  reference local_60;
  
  this_01 = in_RDI;
  bVar1 = has_relative_path(in_stack_ffffffffffffff40);
  if (bVar1) {
    end((path *)in_RDI);
    this_00 = iterator::operator--(in_stack_ffffffffffffff30);
    local_60 = iterator::operator*(this_00);
    fmt = (format)((ulong)this_00 >> 0x20);
    local_78 = std::__cxx11::string::rfind((char)local_60,0x2e);
    if ((local_78 == -1) || (local_78 == 0)) {
      bVar1 = false;
    }
    else {
      std::__cxx11::string::substr((ulong)local_98,(ulong)local_60);
      path((path *)this_01,in_RDI,fmt);
      std::__cxx11::string::~string(local_98);
      bVar1 = true;
    }
    iterator::~iterator((iterator *)0x1d2683);
    if (bVar1) {
      return (path *)this_01;
    }
  }
  path((path *)0x1d26aa);
  return (path *)this_01;
}

Assistant:

GHC_INLINE path path::extension() const
{
    if (has_relative_path()) {
        auto iter = end();
        const auto& fn = *--iter;
        impl_string_type::size_type pos = fn._path.rfind('.');
        if (pos != std::string::npos && pos > 0) {
            return path(fn._path.substr(pos), native_format);
        }
    }
    return path();
}